

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void * duckdb_je_base_alloc_rtree(tsdn_t *tsdn,base_t *base,size_t size)

{
  size_t in_RAX;
  void *pvVar1;
  void *pvVar2;
  size_t usize;
  size_t local_18;
  
  local_18 = in_RAX;
  pvVar1 = base_alloc_impl(tsdn,base,size,0x40,(size_t *)0x0,&local_18);
  pvVar2 = (void *)0x0;
  if (pvVar1 != (void *)0x0) {
    base->rtree_allocated = base->rtree_allocated + local_18;
    pvVar2 = pvVar1;
  }
  return pvVar2;
}

Assistant:

void *
base_alloc_rtree(tsdn_t *tsdn, base_t *base, size_t size) {
	size_t usize;
	void *rtree = base_alloc_impl(tsdn, base, size, CACHELINE, NULL,
	    &usize);
	if (rtree == NULL) {
		return NULL;
	}
	if (config_stats) {
		base->rtree_allocated += usize;
	}
	return rtree;
}